

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O2

CURLcode smb_send_message(connectdata *conn,uchar cmd,void *msg,size_t msg_len)

{
  CURLcode CVar1;
  
  CVar1 = Curl_get_upload_buffer(conn->data);
  if (CVar1 != CURLE_OK) {
    return CVar1;
  }
  smb_format_message(conn,(smb_header *)(conn->data->state).ulbuf,cmd,msg_len);
  memcpy((conn->data->state).ulbuf + 0x24,msg,msg_len);
  CVar1 = smb_send(conn,msg_len + 0x24,0);
  return CVar1;
}

Assistant:

static CURLcode smb_send_message(struct connectdata *conn, unsigned char cmd,
                                 const void *msg, size_t msg_len)
{
  CURLcode result = Curl_get_upload_buffer(conn->data);
  if(result)
    return result;
  smb_format_message(conn, (struct smb_header *)conn->data->state.ulbuf,
                     cmd, msg_len);
  memcpy(conn->data->state.ulbuf + sizeof(struct smb_header),
         msg, msg_len);

  return smb_send(conn, sizeof(struct smb_header) + msg_len, 0);
}